

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.cc
# Opt level: O2

int __thiscall lock::check(lock *this,char *bytes,int length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  
  bVar1 = *bytes;
  this->aRealKey[0] = bVar1;
  bVar2 = bytes[1];
  this->aRealKey[1] = bVar2;
  bVar3 = bytes[2];
  this->aRealKey[2] = bVar3;
  bVar4 = bytes[3];
  this->aRealKey[3] = bVar4;
  iVar5 = this->modulo;
  uVar11 = (long)(int)((uint)bVar3 << 8 | (uint)bVar2 << 0x10 | (uint)bVar1 << 0x18 | (uint)bVar4) %
           (long)iVar5;
  uVar10 = uVar11 & 0xffffffff;
  uVar9 = (uint)uVar11 & 0x1f;
  uVar11 = 7;
  if (7 < uVar9) {
    uVar11 = (ulong)uVar9;
  }
  iVar6 = this->slope;
  iVar7 = this->offset;
  bVar8 = true;
  for (lVar12 = 0; uVar11 - 4 != lVar12; lVar12 = lVar12 + 1) {
    uVar10 = (long)((int)uVar10 * iVar6 + iVar7) % (long)iVar5 & 0xffffffff;
    this->aRealKey[lVar12 + 4] = (char)uVar10;
    bVar8 = (bool)(bVar8 & (char)uVar10 == bytes[lVar12 + 4]);
  }
  if (bVar8 != false) {
    bVar8 = (int)uVar11 == length;
  }
  this->aRealKeyLength = (int)uVar11;
  return (int)bVar8;
}

Assistant:

int lock::check(char * bytes, int length) {
  aRealKey[0] = bytes[0];
  aRealKey[1] = bytes[1];
  aRealKey[2] = bytes[2];
  aRealKey[3] = bytes[3];
  int seed = ((aRealKey[0] << 24) + ((aRealKey[1] << 16) & 0xff0000) +
          ((aRealKey[2] << 8) & 0xff00) + (aRealKey[3] & 0xff));
  seed = seed % modulo;
  int size = seed & KEY_MASK;
  if (size < 7) {
    size = 7;
  }
  int index = 4;
  bool goodKey = true;
  while (index < size) {
    seed = (seed * slope + offset) % modulo;
    aRealKey[index] = seed & 0xff;
    goodKey &= aRealKey[index] == bytes[index];
    index++;
  }
  if (goodKey) {
    goodKey = size == length;  // if we don't match the input size it
                               // can't be a good key
  }
  aRealKeyLength = size;
  return (goodKey ? 1 : 0);
}